

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall Emitter::convertUnits(Emitter *this,Network *network)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (network->units).factors[5];
  dVar2 = pow((network->units).factors[4],this->expon);
  this->flowCoeff = (dVar2 / dVar1) * this->flowCoeff;
  return;
}

Assistant:

void Emitter::convertUnits(Network* network)
{
    // ... get units conversion factors

    double qUcf = network->ucf(Units::FLOW);
    double pUcf = network->ucf(Units::PRESSURE);

    // ... convert flowCoeff from user flow units per psi (or meter)
    //     to cfs per foot of head

    flowCoeff *= pow(pUcf, expon) / qUcf;
}